

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

MethodDescriptorProto * __thiscall
google::protobuf::MethodDescriptorProto::New(MethodDescriptorProto *this,Arena *arena)

{
  MethodDescriptorProto *this_00;
  
  this_00 = (MethodDescriptorProto *)operator_new(0x40);
  MethodDescriptorProto(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::MethodDescriptorProto>(arena,this_00);
  }
  return this_00;
}

Assistant:

MethodDescriptorProto* MethodDescriptorProto::New(::google::protobuf::Arena* arena) const {
  MethodDescriptorProto* n = new MethodDescriptorProto;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}